

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qualengine.cpp
# Opt level: O2

void __thiscall QualEngine::~QualEngine(QualEngine *this)

{
  int in_ESI;
  
  close(this,in_ESI);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&(this->flowDirection).super__Vector_base<char,_std::allocator<char>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->sortedLinks).super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

QualEngine::~QualEngine()
{
    close();

//    cout << "\nQualEngine destructed.\n";
}